

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

XMLElement * CMU462::Collada::ColladaParser::get_technique_cmu462(XMLElement *xml)

{
  bool bVar1;
  XMLElement *this;
  char *__s;
  XMLElement *unaff_R13;
  XMLElement *pXVar2;
  string profile;
  allocator<char> local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"extra/technique",(allocator<char> *)&local_50);
  this = get_element(xml,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  do {
    if (this == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    __s = tinyxml2::XMLElement::Attribute(this,"profile",(char *)0x0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
    bVar1 = std::operator==(&local_50,"CMU462");
    pXVar2 = this;
    if (!bVar1) {
      this = tinyxml2::XMLNode::NextSiblingElement(&this->super_XMLNode,"technique");
      pXVar2 = unaff_R13;
    }
    std::__cxx11::string::~string((string *)&local_50);
    unaff_R13 = pXVar2;
  } while (!bVar1);
  return pXVar2;
}

Assistant:

XMLElement* ColladaParser::get_technique_cmu462( XMLElement* xml ) {

  XMLElement* technique = get_element(xml, "extra/technique");
  while (technique) {
    string profile = technique->Attribute("profile");
    if (profile == "CMU462") return technique;
    technique = technique->NextSiblingElement("technique");
  }

	return NULL;

}